

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_> * __thiscall
rangeless::fn::impl::where_max_by<rangeless::fn::by::identity>::operator()
          (vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>
           *__return_storage_ptr__,where_max_by<rangeless::fn::by::identity> *this,
          view<__gnu_cxx::__normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>
          cont)

{
  uint uVar1;
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  __args;
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  _Var2;
  size_type __n;
  size_type sVar3;
  int iVar4;
  X *__args_00;
  __normal_iterator<rangeless::fn::impl::X_*,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>
  _Var5;
  
  __args = cont.it_beg._M_current;
  (__return_storage_ptr__->
  super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  if (__args._M_current != cont.it_end._M_current._M_current) {
    __n = 1;
    _Var5._M_current = __args._M_current;
    _Var2._M_current = __args._M_current;
    while( true ) {
      _Var2._M_current = _Var2._M_current + 1;
      if (_Var2._M_current == cont.it_end._M_current._M_current) break;
      uVar1 = (uint)((__args._M_current)->value < (_Var2._M_current)->value);
      if ((_Var2._M_current)->value < (__args._M_current)->value) {
        uVar1 = 0xffffffff;
      }
      iVar4 = uVar1 * this->use_max;
      sVar3 = __n + 1;
      if (iVar4 != 0) {
        sVar3 = 1;
      }
      if (-1 < iVar4) {
        _Var5._M_current = _Var2._M_current;
      }
      if (0 < iVar4) {
        __args._M_current = _Var2._M_current;
      }
      if (-1 < iVar4) {
        __n = sVar3;
      }
    }
    std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::reserve
              (__return_storage_ptr__,__n);
    std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::
    emplace_back<rangeless::fn::impl::X>(__return_storage_ptr__,__args._M_current);
    while (__args_00 = __args._M_current + 1, __args._M_current != _Var5._M_current) {
      iVar4 = (__return_storage_ptr__->
              super__Vector_base<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>).
              _M_impl.super__Vector_impl_data._M_finish[-1].value;
      uVar1 = (uint)(iVar4 < __args_00->value);
      if (__args_00->value < iVar4) {
        uVar1 = 0xffffffff;
      }
      __args._M_current = __args_00;
      if (-1 < (int)(uVar1 * this->use_max)) {
        std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>::
        emplace_back<rangeless::fn::impl::X>(__return_storage_ptr__,__args_00);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Ret operator()(Container cont) const
        {
            // TODO: Take Container as forwarding reference instead of by value
            // such that if it is passed by lvalue-reference we don't need to
            // copy all elements; will only copy the maximal ones.
            // (copy or move value from the iterator depending on whether 
            // cont is lvalue or rvalue-reference?)

            // NB[2]: if we're taking lvalue of key_fn(element),
            // be mindful that key may contain references to keyed object.
            // (hopefully const, but we can't even assume that).
            // (e.g. make_tuple(....) unwraps reference-wrappers and returns
            // a tuple that may contain references.
            //
            // Therefore:
            // 1) we can't reassign keys, e.g. best_key = max(best_key, current_key),
            //    as this will assign the internal reference (if non-const)
            //    or will not compile (if reference is const).
            //
            // 2) The value of key may become invalidated if referenced
            //    element is assigned or moved from (explicitly, or under the hood, 
            //    e.g. while reallocating when a std::vector is resized in push_back,
            //    or when the element is moved to a different position by erase-remove
            //    algorithm.
           
            // NB: we could reuse the same logic for both input and Container use-cases,
            // but having multi-pass capability with Container allows us to do less
            // memory churn (we only need to move elements-of-interest into ret).

            Ret ret{};

            if(cont.empty())
                return ret;
            
            auto first_best_it = cont.begin();
            auto last_best_it  = cont.begin();
            size_t n = 1; // count of max-elements

            {
                auto it = cont.begin();
                for(++it; it != cont.end(); ++it) {
                    const int which = impl::compare(key_fn(*it), 
                                                    key_fn(*first_best_it)) * use_max;
                    if(which < 0) {
                        ; // not-best
                    } else if(which > 0) {
                        // new-best
                        first_best_it = last_best_it = it;
                        n = 1;
                    } else {
                        last_best_it = it;
                        n++;
                    }
                }
            }

            ret.reserve(n);
            ret.push_back(std::move(*first_best_it));
            ++first_best_it;
            ++last_best_it; // convert to end

            for(auto it = first_best_it; it != last_best_it; ++it) 
                if(impl::compare(key_fn(*it), 
                                 key_fn(ret.back())) * use_max >= 0)
            {
                ret.push_back(std::move(*it));
            }

            return ret;
            
#if 0 // An example of what NOT to do:
            auto best_key = key_fn(*cont.begin());
            for(const auto& e : cont) {
                auto key = key_fn(e);
                if(impl::compare(best_key, key)*use_max > 0) {
                    best_key = std::move(key);  // BUG: modifies referenced object via
                                                // internal non-const references in key.
                                                // (or will not compile if references are const)
            }

            return fn::where(
                    [&, this](const typename Ret::value_type& x)
                    {
                        return impl::compare(key_fn(x), best_key)*use_max >= 0;
                    })(std::forward<Container>(cont));
            // BUG: best_key may contain a reference, which is invalidated mid-processing
            // when best-element is moved inside erase-remove loop in fn::where.
#endif
        }
    };


    /////////////////////////////////////////////////////////////////////
    struct reverse
    {
        template<typename Gen>
        auto operator()(seq<Gen> r) const -> std::vector<typename seq<Gen>::value_type>
        {
            auto vec = to_vector{}(std::move(r));
            std::reverse(vec.begin(), vec.end());
            return vec;
        }

#if 0
        template<typename Iterable>
        struct reversed
        {
            Iterable src;
            using value_type     = typename Iterable::value_type;
            using iterator       = typename Iterable::reverse_iterator;
            using const_iterator = typename Iterable::const_reverse_iterator;

            iterator begin()
            {
                return src.rbegin();
            }

            iterator end()
            {
                return src.rend();
            }

            const_iterator begin() const
            {
                return src.rbegin();
            }

            const_iterator end() const
            {
                return src.rend();
            }

            const_iterator cbegin() const
            {
                return src.crbegin();
            }

            const_iterator cend() const
            {
                return src.crend();
            }
        };

        template<typename Iterable>
        reversed<Iterable> operator()(Iterable src) const
        {
            return reversed<Iterable>{ std::move(src) };
        }

#else   // The above approach is more clever, and works for all containers that support bidirectional iteration.
        // In practice, however, the input is a vector and the user programmer expects the reversed vector as output.
        // So in the spirit of pragmatism, will expect a reversible sequence container as input, and reverse eagerly.
        // (Since it costs at least O(n) to create a container, reversing in O(n) does not add
        // to asymptotic complexity).

        template<typename ReversibleContainer>
        auto operator()(ReversibleContainer cont) const -> ReversibleContainer
        {
            std::reverse(cont.begin(), cont.end()); // compilation hint: expecting ReversibleContainer - consider fn::to_vector() first.
            return cont;
        }
#endif

        template<typename Iterator>
        view<std::reverse_iterator<Iterator>> operator()(view<Iterator> v) const
        {
            impl::require_iterator_category_at_least<std::bidirectional_iterator_tag>(v);

            using rev_it_t = std::reverse_iterator<Iterator>;
            return { rev_it_t{ v.end()   }, 
                     rev_it_t{ v.begin() } };
        }
    };

    // NB: sort and reverse have identical signatures for overloads

    /////////////////////////////////////////////////////////////////////
    // I made a decision to deviate from STL naming convention,
    // where std::sort is unstable, and made fn::sort/sort_by a stable-sort.
    // 
    // I think STL should have followed the principle of least astonishment and made
    // std::sort a stable-sort, and have an additonal std::unstable_sort version.
    // (STL is known for its poor names that tend to surprise novice programmers).
    // That is, by default sort should do "the most right" thing,
    // and have an differently named (e.g. "unstable_sort") optimizing
    // version that can make additional assumptions about the inputs.
    //
    // In real-life sort_by/group_all_by/unique_all_by use-cases we don't 
    // simply sort ints or strings where unstable-sort would do; rather,
    // we sort some objects by some subset of properties, where the sort-key only
    // partially differentiates between the objects, and a two objects
    // that are equivalent according to the sort key don't necessarily
    // compare equal, and so we shouldn't be swapping their relative order.
    struct stable_sort_tag {};
    struct unstable_sort_tag {};
    template<typename F, typename SortTag = stable_sort_tag>
    struct sort_by
    {
        const F key_fn;

        template<typename Gen>
        auto operator()(seq<Gen> r) const -> std::vector<typename seq<Gen>::value_type>
        {
            return this->operator()(to_vector{}(std::move(r)));
        }

        template<typename Iterable>
        Iterable operator()(Iterable src) const
        {
            impl::require_iterator_category_at_least<std::random_access_iterator_tag>(src);

            // this will fire if Iterable is std::map, where value_type is std::pair<const Key, Value>,
            // which is not move-assignable because of constness.
            static_assert(std::is_move_assignable<typename Iterable::value_type>::value, "value_type must be move-assignable.");

            s_sort( src, 
                    [this](const typename Iterable::value_type& x, 
                           const typename Iterable::value_type& y)
                    {
                        return lt{}(key_fn(x), key_fn(y));
                    }
                    , SortTag{});

            return src;
        }

    private:
        template<typename Iterable, typename Comp>
        static void s_sort(Iterable& src, Comp comp, stable_sort_tag)
        {
            std::stable_sort(src.begin(), src.end(), std::move(comp)); // [compilation-error-hint]: expecting sortable container; try fn::to_vector() first.
        }

        template<typename Iterable, typename Comp>
        static void s_sort(Iterable& src, Comp comp, unstable_sort_tag)
        {
            std::sort(src.begin(), src.end(), std::move(comp)); // [compilation-error-hint]: expecting sortable container; try fn::to_vector() first.
        }
    };

    /////////////////////////////////////////////////////////////////////////

    // NB: initially thought of having stable_sort_by and unstable_sort_by versions,
    // and for unstable_sort_by/Container use std::sort, and for unstable_sort_by/seq<..>
    // seq use lazy heap sort. The unstable-ness, however, is different between the two. 
    // So instead decided to go with lazy_sort_by for both Container and seq<>

    // Initially dump all elements and heapify in O(n);
    // lazily yield elements with pop_heap in O(log(n))
    //
    // TODO: can we make this stable? E.g. falling-back on pointer comparison (probably not)
    // or keeping a vector of std::pair<decltype(gen()), size_t> where ::second is the 
    // original ordinal.
    template<typename F>
    struct lazy_sort_by
    {
        const F key_fn;

        template<typename InGen>
        struct gen
        {
              InGen gen;
            const F key_fn;

            using value_type = typename InGen::value_type;
            using vec_t = std::vector<value_type>;

            static_assert(std::is_move_assignable<value_type>::value, "value_type must be move-assignable.");

            vec_t heap;
             bool heapified;

            auto operator()() -> maybe<value_type>
            {
                auto op_gt = [this](const value_type& x, 
                                    const value_type& y)
                {
                    return lt{}(key_fn(y), key_fn(x));
                };

                if(!heapified) {
                    assert(heap.empty());
                    heapified = true;

                    // TODO: if gen is to_gen wrapper, move elements
                    // directly from the underlying Iterable.
                    for(auto x = gen(); x; x = gen()) {
                        heap.push_back(std::move(*x));
                    }

                    std::make_heap(heap.begin(), heap.end(), op_gt);
                }

                if(heap.empty()) {
                    return { };
                }

                std::pop_heap(heap.begin(), heap.end(), op_gt);
                auto ret = std::move(heap.back());
                heap.pop_back();
                return { std::move(ret) };
            }
        };

        RANGELESS_FN_OVERLOAD_FOR_SEQ(  key_fn, {}, false )
        RANGELESS_FN_OVERLOAD_FOR_CONT( key_fn, {}, false )
    };

    /////////////////////////////////////////////////////////////////////
    template<typename F>
    struct take_top_n_by
    {
        const F      key_fn;
        const size_t capacity;

        template<typename Iterable>
        auto operator()(Iterable src) const -> std::vector<typename Iterable::value_type>
        {
            // TODO: if Iterable is a vector, do partial-sort, decreasing, take_first(n), and reverse.
            //
            // Take by forwarding-reference here instead of by-value?
            // (Same question as in where_max_by)

            using value_type = typename Iterable::value_type;

            // this will fire if Iterable is std::map, where value_type is std::pair<const Key, Value>,
            // which is not move-assignable because of constness.
            static_assert(std::is_move_assignable<value_type>::value, "value_type must be move-assignable.");

            auto op_gt = [this](const value_type& x, 
                                const value_type& y)
            {
                return lt{}(key_fn(y), key_fn(x));
            };

            // NB: can't use priority_queue, because it provides 
            // const-only exposition of elements, so we can't use
            // it with move-only types.

            std::vector<value_type> heap{};  // min-heap, (min at front)
            heap.reserve(capacity);

            if(capacity > 0)
                for(auto&& x : src)
                    if(heap.size() < capacity || lt{}(key_fn(heap.front()), key_fn(x)))
            {
                if(heap.size() >= capacity) {
                    std::pop_heap(heap.begin(), heap.end(), op_gt);
                    heap.pop_back();
                }

                heap.push_back(std::move(x));
                std::push_heap(heap.begin(), heap.end(), op_gt);
            }

            std::sort_heap(heap.begin(), heap.end(), op_gt);
            std::reverse(heap.begin(), heap.end());
            
            return heap;
        }
    };

    /////////////////////////////////////////////////////////////////////
    template<typename F, typename BinaryPred = impl::eq>
    struct group_adjacent_by
    {
        // We parametrize to both key_fn and pred2 to reuse
        // this for both
        // group_adjacent_by: key_fn:user-provided,      pred2=impl::eq
        // group_adjacent_if: key_fn=impl::by::identity, pred2:user-provided.
        
                 const F key_fn;
        const BinaryPred pred2;

        /////////////////////////////////////////////////////////////////////
        // A simple version that accumulates equivalent-group in a vector, 
        // and yield vector_t. This makes it easy to deal-with (no seq-of
        // seqs), but it needs to allocate a return std::vector per-group.
        // (Edit: unless the use-case supports recycling (see below))
        //
        template<typename InGen>
        struct gen
        {
                          InGen gen;
                        const F key_fn;
               const BinaryPred pred2;

            using inp_t      = typename InGen::value_type;

            using value_type = typename std::conditional<
                                    std::is_same<inp_t, char>::value, 
                                        std::string, 
                                        std::vector<inp_t> >::type;

            static_assert(std::is_move_assignable<value_type>::value, "value_type must be move-assignable.");


            value_type next;
            value_type garbage;

            // instead of allocating a new vector, the caller, prior to calling
            // the operator(), may choose to disown existing vector so we can
            // reuse its internal storage

            void recycle(value_type& grbg)
            {
                garbage = std::move(grbg);
            }

            auto operator()() -> maybe<value_type>
            {
                // NB: number of calls to key_fn shall be max(0, 2*(n-1))
                // (as required by fn::chunker)

                auto curr = std::move(next);
                next = std::move(garbage);
                next.clear(); // clearing does not deallocate internal storage

                for(auto x = gen(); x; x = gen()) {
                    if(curr.empty() || pred2(key_fn(curr.back()), key_fn(*x))) {
                        curr.push_back(std::move(*x));
                    } else {
                        next.push_back(std::move(*x));
                        break;
                    }
                }

                if(curr.empty()) {
                    return { };
                }
                
                return std::move(curr);
            }
        };

        RANGELESS_FN_OVERLOAD_FOR_SEQ( key_fn, pred2, {}, {} )

        // view may be an InputRange, so treat as seq.
        RANGELESS_FN_OVERLOAD_FOR_VIEW( key_fn, pred2, {}, {} )

        /////////////////////////////////////////////////////////////////////
        template<typename Container>
        auto operator()(Container cont) const -> std::vector<Container>
        {
            // NB: number of calls to key_fn shall be max(0, 2*(n-1))
            // (see chunker)

            std::vector<Container> ret;

            auto it = cont.begin();
            const auto it_end = cont.end();

            if(it == it_end) {
                return ret;
            }

            ret.push_back(Container{});
            ret.back().insert(ret.back().end(), std::move(*it)); // [compilation-error-hint]: Expecting Container's value-type to be end-insertable container.
            ++it;

            for(; it != it_end; ++it) {
                if(!pred2(key_fn(*ret.back().rbegin()), // NB: last! NB[4]: not crbegin() here, see discussion below
                          key_fn(*it)))
                {
                    ret.push_back(Container{});
                }
                auto& dest = ret.back();
                dest.insert(dest.end(), std::move(*it));
            }

            // If key_fn is e.g. [](auto&& x){ return std::tie(arg); } 
            // then the return type will be std::tuple<X&> or std::tuple<const X&> depending
            // on constness of x, so the args passed to pred2 must be of the same constness,
            // or it will fail to match to pred2::operator(const T&, const T&)

            return ret;
        }
    };


    /////////////////////////////////////////////////////////////////////
    template<typename F, typename BinaryPred = impl::eq>
    struct group_adjacent_as_subseqs_by
    {
                 const F key_fn;
        const BinaryPred pred2;

        template<typename InGen>
        struct gen
        {
            // subgen for subseq - yield elements of the same group
            struct subgen
            {
                using value_type = typename InGen::value_type;
                gen* parent;

                maybe<value_type> operator()()
                {
                    assert(parent);
                    return parent->next();
                }
            };

            /////////////////////////////////////////////////////////////////

            using element_type = typename InGen::value_type;
            using value_type = seq<subgen>;

                          InGen in_gen;
                        const F key_fn;
               const BinaryPred pred2;   // returns true iff two elemens belong to same group
            maybe<element_type> current; // current element of the current group
                           bool reached_subend; 

            /////////////////////////////////////////////////////////////////

            maybe<element_type> next() // called from subgen::operator()()
            {
                if(!current || reached_subend) {
                    reached_subend = true;
                    return {};
                }

                auto nxt = in_gen(); // not "next" to avoid shadow-warning
                reached_subend = !nxt || !pred2(key_fn(*current), key_fn(*nxt));
                std::swap(current, nxt);
                return std::move(nxt);
            }
            
            maybe<value_type> operator()() // return seq for next group
            {
                if(!current) { // starting initial group
                    current = in_gen();
                } else {

                    // NB: the user-code may have accessed the group only
                    // partially (or not at all), in which case we must skip
                    // over the rest elements in the group until we reach 
                    // the next one.
                    while(!reached_subend) {
                        next();
                    }
                }

                if(!current) { // reached final end
                    return {};
                }

                reached_subend = false;
                return { subgen{ this } };
            }
        };

        RANGELESS_FN_OVERLOAD_FOR_SEQ(  key_fn, pred2, {}, false )
        RANGELESS_FN_OVERLOAD_FOR_VIEW( key_fn, pred2, {}, false )
        RANGELESS_FN_OVERLOAD_FOR_CONT( key_fn, pred2, {}, false )
    };


    /////////////////////////////////////////////////////////////////////
    // used for in_groups_of(n)
    struct chunker
    {
        const size_t chunk_size;
        mutable size_t n_calls;

        template<typename T>
        size_t operator()(const T&) const
        {
            // chunker is called with group_adjacent_by.
            // If we had one call to key_fn per element, 
            // we could chunk in groups of 10 like
            // elems % fn::group_adjacent_by([n = 0UL](const auto){ return n++/10; });
            //
            // in group_adjacent_by we call the key_fn 2*(n-1) times.
            return ++n_calls/2/chunk_size;
        }
    };

    /////////////////////////////////////////////////////////////////////
    template<typename F>
    struct group_all_by
    {
    private:
        using group_adjacent_by_t = group_adjacent_by<F>;

    public:
        const F key_fn;

        // group_all_by: convert input to vector, sort by key_fn, 
        // and delegate to group_adjacent_by::gen
        //
        // (could instead delegate to the eager overload below,
        // since we need to do the sort anyway, but the difference
        // is that group_adjacent_by will recycle std::vector storage
        // while yielding groups one by one, rather than having to
        // allocate a separate std::vector per-group.

        template<typename Gen>  // Container or seq<...>
        auto operator()(seq<Gen> inps) const -> 
            seq<
                typename group_adjacent_by_t::template gen<
                    to_seq::gen<
                        std::vector<typename seq<Gen>::value_type>>>>
        {
            return 
                group_adjacent_by_t{ key_fn, {} }(
                    impl::to_seq{}(
                        sort_by<F>{ key_fn }(
                            impl::to_vector{}(
                                std::move(inps)))));
        }

        /////////////////////////////////////////////////////////////////
        template<typename Container>
        auto operator()(Container cont) const
            //-> std::vector<std::vector<typename Container::value_type>>
            //The above is almost correct, except if Container is a map,
            //conversion to vector removes the key-constness, so we
            //need to do it via decltype
            -> decltype(
                    group_adjacent_by_t{ key_fn, {} }(
                        impl::to_vector{}(
                            std::move(cont))))
        {
#if 0 
            // An example of what not to do
            using key_t = remove_cvref_t<decltype(key_fn(*cont.begin()))>;
            std::map<key_t, Container, lt_t> m;
            for(auto&& x : cont) {
                auto& dest = m[key_fn(x)];
                dest.insert(dest.end(), std::move(x)); 
                // BUG: the key in the map just became invalidated
                // after move(x), if it contained references to it.
            }
            cont.clear(); 

            std::vector<Container> ret;
            ret.reserve(m.size());
            for(auto& kv : m) {
                ret.push_back(std::move(kv.second));
            }
            return ret;

            // Can't also implement is as collect elems into
            // std::set<Container, decltype(opless_by_keyfn_on_element)>,
            // because if value_type is move-only, we won't be able
            // to move-out the elements from the set since 
            // set provides only const access to the elements.
#else
            return group_adjacent_by_t{ key_fn, {} }(
                impl::sort_by<F>{ key_fn }(
                    impl::to_vector{}(
                        std::move(cont))));
#endif
        }
    };



    /////////////////////////////////////////////////////////////////////
    // Flatten a range-of-ranges.
    // Inverse of group_all_by or group_adjacent_by(original elements are in key-order)
    //
    // This is the bind operator for the List monad.
    //
    // What do we name this? 
    //
    //    Haskell: concat
    //     Elixir: concat
    //        Elm: concat
    //     O'Caml: concat, flatten
    //      Scala: flatten
    //    clojure: flatten
    //     python: chain
    //          D: chain
    //         F#: collect
    // javascript: flat
    //   range-v3: join
    //       LINQ: SelectMany
    //
    struct concat
    {
        template<typename InGen>
        struct gen
        {
            InGen gen;

            using gen_value_t = typename InGen::value_type;
            using group_t     = maybe<gen_value_t>;
                               // via maybe, because might not be default-constructible;
                               // or could be a seq<...>, holding a closure under the hood,
                               // rendering the seq not move-assigneable.

            using iterator    = typename gen_value_t::iterator;
            using value_type  = typename gen_value_t::value_type;

             group_t current_group;
            iterator it;

#if 0       // We don't really need this

            // -Weffc++ recommends explicit assignment operator because
            // we have pointer members (presumably current_group), so we
            // explicitly make this move-only.
            gen& operator=(gen&&) = default;
                       gen(gen&&) = default;
            
            gen& operator=(const gen&) = delete;
                       gen(const gen&) = delete;
#endif

            auto operator()() -> maybe<value_type>
            {
                if(current_group) {
                    // NB: we do not return { std::move(*it++) },
                    // and instead the defer the increment until
                    // the next call, because the user code consuming ret may have
                    // side-effects that affect how and whether the
                    // iterator is advanced, so we don't want to advance
                    // it prematurely. 
                    //
                    // For example, ret's type could be
                    // some proxy-object that will fetch an object from a stream,
                    // and the lazy-sequnece's operator++ checks whether
                    // the stream is empty to check whether it reached end.
                    ++it;
                }

                while(!current_group || it == (*current_group).end()) {
                    current_group = gen();
                    
                    if(!current_group) {
                        return { };
                    }

                    it = (*current_group).begin();
                }

                return { std::move(*it) };
            }
        };

        RANGELESS_FN_OVERLOAD_FOR_SEQ( {}, typename gen<InGen>::iterator() )
                                    //^^ simply {} does not compile with GCC-4.9.3

        /////////////////////////////////////////////////////////////////
        
        template<typename Iterable,
                 typename Ret = typename Iterable::value_type>
        Ret operator()(Iterable src) const
        {
            // TODO: return a vector instead? What if cont is a set or a map?

            Ret ret{};
            ret.clear(); // [compilation-error-hint]: Expecting Iterable::value_type to be a container.

            for(auto&& v : src) {
                ret.insert(ret.end(),
                           std::make_move_iterator(v.begin()),
                           std::make_move_iterator(v.end()));
            }

            return ret;
        }

        // The case of vector-of-seq can't be handled by the above overload,
        // because seq can't be end-inserted into.
        // So we'll wrap container-of-seq into seq, and treat as seq-of-seq.
        template<typename Gen>
        auto operator()(std::vector<seq<Gen>> vec_of_seqs) const
          -> seq<gen< to_seq::gen< std::vector<seq<Gen>> > >>
        {                       //^^^^^^^^^^^^^^^^^^^^^       input vec
                     //^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^     wrapped as seq
          //^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^  composed with this
          // TODO: needs a test.

            return { { { std::move(vec_of_seqs) } } };
        }
    };


    /////////////////////////////////////////////////////////////////////
    template<typename F>
    struct unique_adjacent_by
    {
        const F key_fn;

        template<typename InGen>
        struct gen
        {
              InGen gen;
            const F key_fn;

            using value_type = typename InGen::value_type;

            using state_t = maybe<value_type>;
            // wrapped into maybe, because might not be default-constructible

            state_t next;

            auto operator()() -> maybe<value_type>
            {
                auto curr = std::move(next);
                next.reset();

                for(auto x = gen(); x; x = gen()) {
                    if(!curr) {
                        curr = std::move(x);
                    } else if( impl::eq{}(key_fn(*curr), key_fn(*x))) {
                        continue; // skip equivalent elements
                    } else {
                        next = std::move(x);
                        break;
                    }
                }

                return curr;
            }
        };

        RANGELESS_FN_OVERLOAD_FOR_SEQ( key_fn, {} )

        template<typename Iterable>
        Iterable operator()(Iterable inps) const
        {
            impl::require_iterator_category_at_least<std::forward_iterator_tag>(inps);

            inps.erase(
                std::unique(
                    inps.begin(), inps.end(),
                    [this](const typename Iterable::value_type& x, 
                           const typename Iterable::value_type& y)
                    {
                        return impl::eq{}(key_fn(x), key_fn(y));
                    }),
                inps.end());

            return inps;
        }
    };



    /////////////////////////////////////////////////////////////////////
    template<typename F>
    struct unique_all_by
    {
        const F key_fn;

        template<typename InGen>
        struct gen
        {
              InGen gen;
            const F key_fn; // lifetime of returned key shall be independent of arg.

            using value_type = typename InGen::value_type;

            using key_t = typename std::decay<decltype(key_fn(*gen()))>::type; 
            // key_fn normally yields a const-reference, but we'll be storing 
            // keys in a map, so need to decay the type (remove_cvref would do).

            static_assert(std::is_default_constructible<key_t>::value, "The type returned by key_fn in unique_all_by must be default-constructible and have the lifetime independent of arg.");
            // In case key_fn returns a reference-wrapper or a tie-tuple containing
            // a reference, these will become invalidated as keys in the map
            // when the referenced object goes out of scope, so we guard against
            // these by requiring default-constructible on key_t.

            using seen_t = std::map<key_t, bool>; 
            // might as well have used std::set, but to #include fewer things will
            // repurpose std::map that's already included for other things.

            seen_t seen;

            auto operator()() -> maybe<value_type>
            {
                auto x = gen();

                if(!x) {
                    return { };
                }
                auto k = key_fn(*x);

                while(!seen.emplace(std::move(k), true).second) {
                    x = gen();
                    if(!x) {
                        break;
                    }
                    k = key_fn(*x);
                }
                return x;
            }
        };

        RANGELESS_FN_OVERLOAD_FOR_SEQ( key_fn, {} )


        template<typename Iterable>
        auto operator()(Iterable src) const
          -> decltype( // see the corresponding overload in group_all_by
                  unique_adjacent_by<F>{ key_fn }(
                      to_vector{}(
                          std::move(src))))
        {
            return unique_adjacent_by<F>{ key_fn }(
                sort_by<F>{ key_fn }(
                    to_vector{}(
                        std::move(src))));
        }
    };


    /////////////////////////////////////////////////////////////////////
    // Concat a pair of (possibly heterogeous) `Iterables`.
    template<typename Iterable2>
    struct append
    {
        Iterable2 src2;

        template<typename Iterable1>
        struct gen
        {
                               Iterable1 inps1;
                               Iterable2 inps2;
            typename Iterable1::iterator it1;
            typename Iterable2::iterator it2;
                                     int which; // 0: not-started; 
                                                // 1: in range1
                                                // 2: in range2
            using value_type = 
                typename std::common_type<
                    typename Iterable1::value_type,
                    typename Iterable2::value_type
                                         >::type;

            auto operator()() -> maybe<value_type>
            {
                return which == 1 && it1 != inps1.end() ? std::move(*it1++)
                     : which == 2 && it2 != inps2.end() ? std::move(*it2++)
                     : which == 0 ? (which = 1, it1 = inps1.begin(), (*this)())
                     : which == 1 ? (which = 2, it2 = inps2.begin(), (*this)())
                     :              maybe<value_type>{ };
            }
        };

        template<typename Iterable1>
        auto operator()(Iterable1 src1) && -> seq<gen<Iterable1>> // rvalue-specific because src2 is moved-from
        {
            return { { std::move(src1), std::move(src2), {}, {}, 0 } };
        }
    };

    /////////////////////////////////////////////////////////////////////
    template<typename Iterable2, typename BinaryFn>
    struct zip_with
    {
        Iterable2 src2;
        BinaryFn  fn;

        template<typename Iterable1>
        struct gen
        {
                                BinaryFn fn;
                               Iterable1 src1;
                               Iterable2 src2;
            typename Iterable1::iterator it1;
            typename Iterable2::iterator it2;
                                    bool started;

            using value_type = decltype(fn(std::move(*it1),
                                           std::move(*it2)));

            auto operator()() -> maybe<value_type>
            {
                if(!started) {
                    it1 = src1.begin();
                    it2 = src2.begin();
                    started = true;
                }

                if(it1 == src1.end() || it2 == src2.end()) {
                    return { };
                }

                auto ret = fn(std::move(*it1), std::move(*it2));
                ++it1;
                ++it2;
                return { std::move(ret) };
            }
        };

        template<typename Iterable1>
        auto operator()(Iterable1 src1) && -> seq<gen<Iterable1>> // rvalue-specific because src2 is moved-from
        {
            return { { std::move(fn), std::move(src1), std::move(src2), {}, {}, false } };
        }
    };

    /////////////////////////////////////////////////////////////////////////
    template<typename BinaryFn>
    struct zip_adjacent
    {    
        BinaryFn fn;

        template<typename Iterable>
        struct gen
        {    
                              BinaryFn fn;
                              Iterable src; 
           typename Iterable::iterator it;
                                  bool started;

            using value_type = decltype(fn(*it, *it));

            auto operator()() -> maybe<value_type>
            {    
                if(!started) {
                    it = src.begin();
                    started = true;
                }    

                auto prev_it = it == src.end() ? it : it++;

                if(it != src.end()) {
                    return { fn(*prev_it, *it) };
                } else {
                    return { }; 
                }    
            }    
        };   

        template<typename Iterable>
        auto operator()(Iterable src) && -> seq<gen<Iterable>>
        {    
            impl::require_iterator_category_at_least<std::forward_iterator_tag>(src);
            return { { std::move(fn), std::move(src), {}, false } }; 
        }    
    };

    /////////////////////////////////////////////////////////////////////////
    template<typename Iterable2, typename BinaryFn>
    struct cartesian_product_with
    {
        Iterable2 src2;
        BinaryFn fn;

        template<typename Iterable1>
        struct gen
        {
                                BinaryFn fn;
                               Iterable1 src1;
                               Iterable2 src2;
            typename Iterable1::iterator it1;
            typename Iterable2::iterator it2;
                                    bool started;

            // Checking against input-range semantics.
            // Checking against moving iterators (yielding rvalue-references)
            // because if fn takes a param by value and the iterator yields 
            // it will be moved-from.
            static_assert(!std::is_rvalue_reference<decltype(*--it1)>::value, "For cartesian-product expecting upstream iterable to be a bidirectional range yielding lvalue-references or values");
            static_assert(!std::is_rvalue_reference<decltype(*--it2)>::value, "For cartesian-product expecting parameter-iterable to be a bidirectional range yielding lvalue-references or values");

            using value_type = decltype(fn(*it1, *it2));

            auto operator()() -> maybe<value_type>
            {
                if(!started) {
                    it1 = src1.begin();
                    it2 = src2.begin();
                    started = true;
                    if(it1 == src1.end() || it2 == src2.end()) {
                        return { };
                    }
                }

                while(it2 == src2.end()) {
                    it2 = src2.begin();

                    ++it1;
                    if(it1 == src1.end()) {
                        return { };
                    }
                }

                auto ret = fn(*it1, *it2);
                ++it2;
                return { std::move(ret) };
            }
        };

        template<typename Iterable1>
        auto operator()(Iterable1 src1) && -> seq<gen<Iterable1>> // rvalue-specific because range2 is moved-from
        {
            return { { std::move(fn), std::move(src1), std::move(src2), {}, {}, false } };
        }
    };

    /////////////////////////////////////////////////////////////////////////

    struct memoizer_detail
    {
        template<class Ret, class Arg>
        struct lambda_traits_detail
        {    
            using ret = Ret; 
            using arg = Arg;
        };   

        template<class L>
        struct lambda_traits
             : lambda_traits<decltype(&L::operator())>
        {};

        // NB: not providing non-const version (must be pure)
        template<class Ret, class Class, class Arg>
        struct lambda_traits<Ret(Class::*)(Arg) const>
             : lambda_traits_detail<Ret, Arg>
        {};
    };

    template<typename F>
    struct memoizer
    {
        using traits = impl::memoizer_detail::lambda_traits<F>;
        using    Arg = typename std::remove_reference<typename traits::arg>::type;
        using    Ret = typename traits::ret;
        using  Cache = std::map<Arg, Ret>;

        // Even after std::remove_reference the type could be e.g. a 
        // tuple containing references which may become dangling, 
        // so to guard against those we're requiring move-assignable.
        //
        // Same goes for the output-type, e.g. if return type is a reference-wrapper
        // we will disallow that to guard against dangling references.
        //
        // (also see unique_all_by)
        static_assert(std::is_default_constructible<Arg>::value, "The argument-type must be default-constructible.");
        static_assert(std::is_default_constructible<Ret>::value, "The return-type type must be default-constructible.");

                    F fn;
        mutable Cache m; // mutable, because operator() must be const
                         // e.g. we may be memoizing some key_fn, and 
                         // those are expected to be const

        const Ret& operator()(const Arg& arg) const
        {
            static_assert(std::is_same<decltype(arg < arg), bool>::value, "The argument-type must have operator< to be viable as std::map key-type.");

            auto it = m.find(arg);
            return it != m.end() ? it->second
                                 : m.emplace(arg, fn(arg)).first->second;
        }
    };

    /////////////////////////////////////////////////////////////////////////
    template<typename F>
    struct scope_guard
    {
           F fn;
        bool dismissed;

        void dismiss()
        {
            dismissed = true;
        }

        ~scope_guard() noexcept(noexcept(fn()))
        {
            if(!dismissed)
                fn(); // NB: it's up to m_fn to decide whether to catch exceptions.
        }
    };


}   // namespace impl

    /////////////////////////////////////////////////////////////////////////

    template<typename T>
    using any_seq_t = impl::seq<impl::any_gen<T>>;

    /// @brief Type-erase a `seq`.
    ///
    /// Wrap the underlying nullary invokable as std::function.
    template<typename Gen, typename T = typename Gen::value_type>
    inline any_seq_t<T> make_typerased(impl::seq<Gen> seq)
    {
#if 0
        return { std::move(seq) };
#else
        // seqs's gen(erator) may contain move-only state, 
        // not satisfying CopyConstructible, so we can't use it
        // for std::function payload for any_gen.
        // So we need to first wrap gen as a shared_ptr and create
        // a copyable gen-wrapper.
        // (there's only going to be a single instance that 
        // is used to construct any_seq_t with, so the state
        // is not actually shared).

        auto gen_ptr = std::make_shared<Gen>( std::move(seq.get_gen()) );
        return {{ 
            [gen_ptr]() -> impl::maybe<T>
            {
                return (*gen_ptr)();
            }
        }};
#endif
    }

    /// @defgroup to_vec to_vector/to_seq
    /// @{

    /// @brief Move elements of an `Iterable` to std::vector.
    inline impl::to_vector to_vector()
    {
        return {};
    }

    /// @brief Wrap an `Iterable`, taken by value, as `seq` yielding elements by-move.
    ///
    /// This is a dual of `to_vector`. It can be used to adapt your own `InputRange` as
    /// `seq`, but it can also be used to wrap a container to force lazy evaluation
    /// e.g. `std::move(container) % fn::to_seq() % fn::group_adjacent_by(key_fn) % fn::take_first()`
    inline impl::to_seq to_seq()
    {
        return {};
    }

    /// e.g. `auto set_of_ints = fn::seq(...) % ... % fn::to(std::set<int>{})`;
    template<typename Container>
    impl::to<Container> to(Container dest)
    {
        return { std::move(dest) };
    }

    /// @brief return map: value_type -> size_t
    inline impl::counts counts()
    {
        return {};
    }


    /// @}
    /// @defgroup transform Transform and Adapt
    ///
    /// @{

    /// @brief Create a custom processing-stage function-object.
    ///
    /// This is somewhat similar to `fn::transform`, except the correspondence between
    /// inputs and outputs is not necessarily 1:1, and instead of taking a single element to transform
    /// we take a nullary generator callable `gen` and use it to fetch however many input elements
    /// we need to generate the next output element.
    /// 
    /// NB: If `bool(gen)==false`, the next invocation of gen() shall throw `fn::end_seq::exception` signaling end-of-inputs.
    /*!
    @code
        auto my_transform = [](auto fn)
        {
            return fn::adapt([fn = std::move(fn)](auto gen)
            {
                return fn(gen());
            });
        };

        auto my_where = [](auto pred)
        {
            return fn::adapt([pred = std::move(pred)](auto gen)
            {
                auto x = gen();
                while(!pred(x)) {
                    x = gen();
                }
                return x;
            });
        };

        auto my_take_while = [](auto pred)
        {
            return fn::adapt([pred = std::move(pred)](auto gen)
            {
                auto x = gen();
                return pred(x) ? std::move(x) : fn::end_seq();
            });
        };

        auto my_intersperse = [](auto delim)
        {
#if 1
            return [delim = std::move(delim)](auto inputs)
            {
                return fn::seq([  delim, 
                                 inputs = std::move(inputs), 
                                     it = inputs.end(), 
                                started = false, 
                                   flag = false]() mutable
                {
                    if(!started) {
                        started = true;
                        it = inputs.begin();
                    }
                    return it == inputs.end() ? fn::end_seq()
                         :     (flag = !flag) ? std::move(*it++)
                         :                      delim;
                });
            };
            
#elif 0 // or

            return [delim = std::move(delim)](auto inputs)
            {
                return std::move(inputs)
              % fn::transform([delim](auto inp)
                {
                    return std::array<decltype(inp), 2>{{ std::move(inp), delim }};
                })
              % fn::concat()
              % fn::drop_last(); // drop trailing delim
            };

#else // or

            return fn::adapt([delim, flag = false](auto gen) mutable
            {
                return           !gen ? fn::end_seq() 
                     : (flag = !flag) ? gen() 
                     :                  delim;
            });
#endif
        };


        auto my_inclusive_scan = []
        {
            return fn::adapt([sum = 0](auto gen) mutable
            {
                return sum += gen();
            });
        };

        auto res = 
            fn::seq([i = 0]() mutable
            {
                return i++;
            })                  // 0,1,2,3,...

          % my_where([](int x)
            {
                return x >= 3; 
            })                  // 3,4,5,...

          % my_take_while([](int x)
            {
                return x <= 5;
            })                  // 3,4,5

          % my_intersperse(-1)  // 3,-1,4,-1,5

          % my_transform([](int x)
            {
                return x + 1;
            })                  // 4,0,5,0,6

          % my_inclusive_scan() // 4,4,9,9,15

          % fn::to_vector();

        VERIFY((res == vec_t{{4, 4, 9, 9, 15}}));
    @endcode

    A more realistic example: suppose you have a pipeline
    transforming inputs to outputs in parallel, and you want to
    compress the output, but the outputs are small and compressing
    them individually would be ineffective, and you want to 
    serialize the incoming results into a buffer of some minimum
    size, e.g. 100kb, before passing it to the compressing stage.
    @code
        auto make_result     = [](std::string s){ return s; };
        auto compress_block  = [](std::string s){ return s; };
        auto write_to_ostr   = [](std::string s){ std::cout << s; };

        namespace fn = rangeless::fn;
        using fn::operators::operator%;

        fn::seq([&]() -> std::string
        {
            std::string line;
            return std::getline(std::cin, line) ? std::move(line) 
                                                : fn::end_seq();
        })

      % fn::transform_in_parallel(make_result)

      % fn::adapt([](auto get_next)
        { 
            std::ostringstream buf{};

            while(get_next && buf.tellp() < 100000) {
                buf << get_next();
            }

            return buf.tellp() ? buf.str() : fn::end_seq();
        })

      % fn::transform_in_parallel(compress_block)

      % fn::for_each(write_to_ostr);

    @endcode
    */
    template<typename F> 
    impl::adapt<F> adapt(F fn)
    {
        return { std::move(fn) };
    }

    ///////////////////////////////////////////////////////////////////////////
    /// @brief Create a `seq` yielding results of applying the transform functions to input-elements.
    ///
    /// Returns a unary function-object, which will capture the arg by value and 
    /// return an adapted `seq<...>` which will yield results of invoking 
    /// `map_fn` on the elements (passed by value) of arg.
    /// See `fn::where` for an example.
    template<typename F> 
    impl::transform<F> transform(F map_fn)
    {
        // Rationale:
        // <br>
        // 1) A possible implementation for a container-input could assume that 
        // `transform` function is inexpensive to recompute on-demand (this is
        // this approach in `range-v3` which may call `transform` multiple times
        // per element depending on the access pattern from the downstream views).
        // 
        // 2) An implementation could require the result-type to be cacheable
        // and assume it is 'light' in terms of memory requirements and memoize the results.
        //
        // Our approach of applying `transform` lazily allows us to
        // make neither assumption and apply `transform` at most once per element and without caching. 
        // The user-code may always follow that by fn::to_vector() when necessary.

        return { std::move(map_fn) };
    }

#if 0
    // see comments around struct composed
    template<typename F, typename... Fs>
    auto transform(F fn, Fs... fns) -> impl::transform<decltype(impl::compose(std::move(fn), std::move(fns)...))>
    {
        return { impl::compose(std::move(fn), std::move(fns)...) };
    }
#endif




    /// @}
    /// @defgroup folding Folds and Loops
    /// @{

    /////////////////////////////////////////////////////////////////////////////
    /*! @brief Range-based version of c++20 (copy-free) `std::accumulate`
     *
     * @see foldl_d
     * @see foldl_1
    @code
        using namespace fn::operators;
        const std::string x = vec_t{ 1, 2, 3 }
          % fn::foldl(std::string{"^"},         // init
                   [](std::string out, int in)  // fold-op
            {
                return std::move(out) + "|" + std::to_string(in);
            });

        VERIFY(x == "^|1|2|3");
    @endcode

    NB: The body of the fold-loop is `init = binary_op(std::move(init), *it);`
    If `it` is a `move`-ing iterator, like that of an `seq`, 
    you'd take `in` by value or rvalue-reference in your binary operator,
    whereas if it's a regular iterator yielding lvalue-references, you'd 
    take it by const or non-const reference.
    */
    template<typename Result, typename Op>
    impl::foldl<Result, Op> foldl(Result init, Op binary_op)
    {
        // NB: idiomatically the init value goes after the binary op,
        // but most of the time binary-op is a multiline lambda, and having
        // the init arg visually far-removed from the call-site 
        // make things less readable, i.e. foldl([](...){ many lines }, init).
        // So placing the binary-op last.
        // (Tried it both ways, and found this order preferable).

        return { std::move(init), std::move(binary_op) };
    }

    /// Fold-Left-with-Default: this version uses default-initialized value for init.
    /*!
     * @see foldl
     * @see foldl_1
    @code
        const std::string x = vec_t{ 1, 2, 3 }
        % fn::foldl_d(
            [](std::string out, int in)
            {
                return std::move(out) + "|" + std::to_string(in);
            });

        VERIFY(x == "|1|2|3");
    @endcode
    */
    template<typename Op>
    impl::foldl_d<Op> foldl_d(Op binary_op)
    {
        return { std::move(binary_op) };
    }

    /////////////////////////////////////////////////////////////////////////////
    /// Init-free version of foldl (first element is used as init); requires at least one element.
    /*!
     * @see foldl
     * @see foldl_d
     * 
    @code
        const auto min_int = 
            std::vector<std::string>{{ "11", "-333", "22" }}
        % fn::transform([](const string& s) { return std::stoi(s); })
        % fn::foldl_1([](int out, int in)   { return std::min(out, in); });

        VERIFY(min_int == -333);
    @endcode
     */
    template<typename Op>
    impl::foldl_1<Op> foldl_1(Op binary_op) 
    {
        return { std::move(binary_op) };
    }


    /// Return a `seq` yielding a view of a fixed-sized sliding window over elements.
    ///
    /// If the input is a `seq`, last `win_size` elements are internally cached in a deque.
    /*!
    @code
        const auto result = 
            make_inputs({ 1,2,3,4 })
          % fn::sliding_window(2)
          % fn::foldl(0L, [](long out, auto v)
            { 
                VERIFY(std::distance(v.begin(), v.end()) == 2);
                auto it = v.begin();
                return (out * 1000) + (*it * 10) + *std::next(it);
            });
        VERIFY(result == 12023034);
    @endcode
    */
    inline impl::sliding_window sliding_window(size_t win_size)
    {
        return { win_size };
    }

    /// Invoke fn on each element.
    ///
    /// NB: this is similar to a left-fold with binary-op `(nullptr_t, x) -> nullptr_t`
    /// where `x` is consumed by-side-effect, and the binary-op is simplified to unary `(x)->void`. 
    template<typename F>
    impl::for_each<F> for_each(F fn)
    {
        return { std::move(fn) };
    }


    /// Invoke binary fn on each pair of adjacent elements.
    ///
    /// NB: the inputs must satisfy `ForwardRange` or stronger.
    template<typename F2>
    impl::for_each_adjacent<F2> for_each_adjacent(F2 fn2)
    {
        return { std::move(fn2) };
    }

    /// @}
    /// @defgroup filtering Filtering
    /// @{
 
    /// @brief Yield elements until pred evaluates to false.
    template<typename P> 
    impl::take_while<P> take_while(P pred)
    {
        return { std::move(pred) };
    }

    /// @brief Yield first `n` elements.
    inline impl::take_while<impl::call_count_lt> take_first(size_t n = 1)
    {
        return {{ n, 0UL }};
    }

    /// @brief Yield last `n` elements.
    ///
    /// Buffering space requirements for `seq`: `O(n)`.
    inline impl::take_last take_last(size_t n = 1)
    {
        return { n };
    }

    /// @brief Drop elements until pred evaluates to false.
    template<typename P> 
    impl::drop_while<P> drop_while(P pred)
    {
        return { std::move(pred) };
    }

    /// @brief Drop first `n` elements.
    inline impl::drop_while<impl::call_count_lt> drop_first(size_t n = 1)
    {
        return {{ n, 0UL }};
    }

    /// @brief Drop last `n` elements.
    ///
    /// Buffering space requirements for `seq`: `O(n)`.
    inline impl::drop_last drop_last(size_t n = 1)
    {
        return { n };
    }

    ///////////////////////////////////////////////////////////////////////////
    /// @brief Filter elements.
    ///
    /// Returns a unary function-object.
    /*!
    @code
        // 1) If arg is a container passed by lvalue-reference,
        // return a copy of the container with elements 
        // satisfying the predicate:
        auto nonempty_strs = strs % fn::where([](auto&& s) { return !s.empty(); });

        // 2.1) If arg is a sequence container passed by rvalue,
        // remove the unsatisfying elements using erase-remove idiom and return the container.
        //
        // 2.2) If arg is a container having equal_range method (sets, associative containers, etc),
        // remove the unsatisfying elements using iterate-erase idiom and return the container.
        strs = std::move(strs) % fn::where([](auto&& s) { return !s.empty(); });

        // 3) If arg is a seq<G>, return adapted seq<...> that shall 
        // yield elements satisfying the predicate:
        auto res = fn::seq([i = 0]
        {
            return i < 5 ? i++ : fn::end_seq();

        }) % fn::where(     [](int x) { return x > 2; }) // 3, 4
           % fn::transform( [](int x) { return x + 1; }) // 4, 5
           % fn::foldl_d(   [](int out, int in) { return out*10 + in; });
        VERIFY(res == 45);
    @endcode
     */
    template<typename P> 
    impl::where<P> where(P pred)
    {
        return { std::move(pred) };
    }

    /// @see `where_in_sorted`
    template<typename SortedForwardRange, typename F> 
    impl::where<impl::in_sorted_by<SortedForwardRange, F> > where_in_sorted_by(const SortedForwardRange& r, F key_fn)
    {
        return { { r, false, { std::move(key_fn) } } };
    }

    ///////////////////////////////////////////////////////////////////////////
    /// @brief Intersect with a sorted range.
    ///
    /// `elems %= fn::where_in_sorted(whitelist);`
    template<typename SortedForwardRange> 
    impl::where<impl::in_sorted_by<SortedForwardRange, by::identity> > where_in_sorted(const SortedForwardRange& r)
    {
        return { { r, false, { { } } } };
    }

    /// @see `where_not_in_sorted`
    template<typename SortedForwardRange, typename F> 
    impl::where<impl::in_sorted_by<SortedForwardRange, F> > where_not_in_sorted_by(const SortedForwardRange& r, F key_fn)
    {
        return { { r, true, { std::move(key_fn) } } };
    }

    ///////////////////////////////////////////////////////////////////////////
    /// @brief Subtract a sorted range.
    ///
    /// `elems %= fn::where_not_in_sorted(blacklist);`
    template<typename SortedForwardRange> 
    impl::where<impl::in_sorted_by<SortedForwardRange, by::identity> > where_not_in_sorted(const SortedForwardRange& r)
    {
        return { { r, true, { { } } } };
    }



    ///////////////////////////////////////////////////////////////////////////
    /// @brief Filter elements to those having maximum value of fn.
    ///
    /*!
    @code
        // 1) If Arg is a container (taken by value), find the max-element
        // and return a vector of max-elements (moved-from the original container).
        strs = std::move(strs) % fn::where_max_by([](auto&& s) { return s.size(); });

        // 2) If Arg is a seq, iterates the seq and returns
        // std::vector<seq<...>::value_type> containing maximal elements.
        auto res = fn::seq([i = 0]
        {
            return i < 5 ? i++ : fn::end_seq();
        }) % fn::where_max_by([](int x) { return x % 2; });
        VERIFY((res == vec_t{{1, 3}}));
    @endcode

    Buffering space requirements for `seq`: `O(k)`, where `k` = maximum number of max-elements in a prefix of seq over all prefixes of seq.
    e.g.
    <br>`[1,0,1,1,0,1,1,9]: k = 5`
    <br>`[1,3,1,1,3,1,1,9]: k = 2`
    */
    template<typename F> 
    impl::where_max_by<F> where_max_by(F key_fn)
    {
        return { std::move(key_fn), 1 };
    }

    inline impl::where_max_by<by::identity> where_max()
    {
        return { by::identity{}, 1 };
    }

    /// Filter elements to those having maximum value of fn.
    /// @see where_max_by
    template<typename F> 
    impl::where_max_by<F> where_min_by(F key_fn)
    {
        return { std::move(key_fn), -1 };
    }

    inline impl::where_max_by<by::identity> where_min()
    {
        return { by::identity{}, -1 };
    }

    /// @code
    /// const bool any  = vals %  fn::exists_where(pred);
    /// const bool none = vals % !fn::exists_where(pred);
    /// const bool all =  vals % !fn::exists_where(not_pred);
    /// @endcode
    template<typename Pred>
    impl::exists_where<Pred> exists_where(Pred p)
    {
        return { std::move(p), true };
    }


    /// @}
    /// @defgroup grouping Grouping
    /// @{

    /// @brief Similar to `group_adjacent_by`, but presorts the elements.
    ///
    /// @see group_adjacent_by
    /*! 
    @code
        using alns_t = std::vector<CRef<CSeq_align>>;
        
        std::move(alignments)

          % fn::group_all_by([&](CConstRef<CSeq_align> aln) 
            {    
                return GetLocusId( aln->GetSeq_id(0) );
            })   

          % fn::for_each([&](alns_t alns)
            {    
                // Process alignments for a locus...
            });  

       Note: template<typename Container> impl::group_all_by<F>::operator()(Container inputs)
       takes Container by-value and moves elements into the output.
    @endcode

    Buffering space requirements for `seq`: `O(N)`.
    */
    template<typename F> 
    impl::group_all_by<F> group_all_by(F key_fn)
    {
        return { std::move(key_fn) };
    }

    inline impl::group_all_by<by::identity> group_all()
    {
        return { by::identity{} };
    }

    /////////////////////////////////////////////////////////////////////////

    /// @brief Group adjacent elements.
    /// @see group_all_by
    /// @see concat
    ///
    /// If arg is a container, works similar to `group_all_by`, except 
    /// returns a `std::vector<Container>` where each container
    /// contains adjacently-equal elements having same value of key.
    ///
    /// If arg is a `seq<...>`, composes a `seq<...>`
    /// that shall yield `vector<value_type>`s having same value of key.
    /// (NB: if the value_type is a char, the group-type is std::string).
    ///
    /// Buffering space requirements for `seq`: `O(max-groupsize)`.
    template<typename F>
    impl::group_adjacent_by<F> group_adjacent_by(F key_fn)
    {
        return { std::move(key_fn), {} };
    }

    /////////////////////////////////////////////////////////////////////////
    /// @brief Group adjacent elements.
    ///
    /// This is similar to regular `group_adjacent_by`, except the result type
    /// is a seq yielding subseqs of equivalent elements, rather than vectors.
    /// @code
    ///     fn::seq(...) 
    ///   % fn::group_adjacent_by(key_fn, fn::to_seq()) 
    ///   % fn::for_each([&](auto group_seq) // type of group_seq is a seq<...> instead of vector<...>
    ///     {
    ///         for(auto elem : group_seq) {
    ///             // ...
    ///         }
    ///     });
    /// @endcode
    ///
    /// This is useful for cases where a subseq can be arbitrarily large, and you want
    /// to process grouped elements on-the-fly without accumulating them in a vector.
    ///
    /// This comes at the cost of more constrained functionality, since all groups and
    /// all elements in each group can only be accessed once and in order.
    template<typename F>
    impl::group_adjacent_as_subseqs_by<F> group_adjacent_by(F key_fn, impl::to_seq)
    {
        return { std::move(key_fn), {} };
    }

    /////////////////////////////////////////////////////////////////////////

    inline impl::group_adjacent_by<by::identity> group_adjacent()
    {
        return { by::identity{}, {} };
    }

    inline impl::group_adjacent_as_subseqs_by<by::identity> group_adjacent(impl::to_seq)
    {
        return { by::identity{}, {} };
    }

    /////////////////////////////////////////////////////////////////////////

    /// @brief Group adjacent elements if binary predicate holds.
    template<typename BinaryPred>
    impl::group_adjacent_by<fn::by::identity, BinaryPred> group_adjacent_if(BinaryPred pred2)
    {
        return { {}, std::move(pred2) };
    }

    /// @brief Group adjacent elements if binary predicate holds.
    template<typename BinaryPred>
    impl::group_adjacent_as_subseqs_by<fn::by::identity, BinaryPred> group_adjacent_if(BinaryPred pred2, impl::to_seq)
    {
        return { {}, std::move(pred2) };
    }

    /////////////////////////////////////////////////////////////////////////


    /// @brief Group adjacent elements into chunks of specified size.
    /*!
    @code
        std::move(elems) 
      % fn::in_groups_of(5)
      % fn::for_each(auto&& group)
        {
            ASSERT(group.size() <= 5);
        });
    @endcode

    Buffering space requirements for `seq`: `O(n)`.
    */
    inline impl::group_adjacent_by<impl::chunker> in_groups_of(size_t n)
    {
        if(n < 1) {
            RANGELESS_FN_THROW("Batch size must be at least 1.");
        }
        return { impl::chunker{ n, 0 }, {} };
    }


    /// @}
    /// @defgroup ordering Ordering
    /// @{

    /// @brief Reverse the elements in the input container.
    ///
    /// Buffering space requirements for `seq`: `O(N)`.
    inline impl::reverse reverse()
    {
        return {};
    }

    /// @brief stable-sort and return the input.
    /*! 
    @code
        auto res = 
            std::list<std::string>{{ "333", "1", "22", "333", "22" }}
          % fn::to_vector()
          % fn::sort_by([](const std::string& s) 
            {
                return fn::by::decreasing(s.size());
            })
          % fn::unique_adjacent();

        VERIFY(( res == std::vector<std::string>{{ "333", "22", "1" }} ));
    @endcode

    Buffering space requirements for `seq`: `O(N)`.
    */
    template<typename F>
    impl::sort_by<F, impl::stable_sort_tag> sort_by(F key_fn)
    {
        return { std::move(key_fn) };
    }

    /// @brief `sort_by with key_fn = by::identity`
    inline impl::sort_by<by::identity, impl::stable_sort_tag> sort()
    {
        return { by::identity{} };
    }


    template<typename F>
    impl::sort_by<F, impl::unstable_sort_tag> unstable_sort_by(F key_fn)
    {
        return { std::move(key_fn) };
    }

    inline impl::sort_by<by::identity, impl::unstable_sort_tag> unstable_sort()
    {
        return { by::identity{} };
    }


    /// @brief Unstable lazy sort.
    ///
    /// Initially move all inputs into a `std::vector` and heapify in `O(n)`,
    /// and then lazily yield elements with `pop_heap` in `O(log(n))`. This is more efficient
    /// if the downstream stage is expected to consume a small fraction of
    /// sorted inputs.
    ///
    /// Buffering space requirements for `seq`: `O(N)`.
    template<typename F>
    impl::lazy_sort_by<F> lazy_sort_by(F key_fn)
    {
        return { std::move(key_fn) };
    }

    /// @brief `lazy_sort_by with key_fn = by::identity`
    inline impl::lazy_sort_by<by::identity> lazy_sort()
    {
        return { by::identity{} };
    }

    /// @brief Return top-n elements, sorted by key_fn.
    ///
    /// This is conceptually similar to `fn::sort_by(key_fn) % fn::take_last(n)`,
    /// but is more efficient: the implementation mantains a priority-queue of
    /// top-n max-elements encountered so-far.
    ///
    /// Buffering space requirements: `O(n)`; time complexity: `O(N*log(n))`
    template<typename F>
    impl::take_top_n_by<F> take_top_n_by(size_t n, F key_fn)
    {
        return { std::move(key_fn), n };
    }

    /// @brief Return top-n elements, sorted by identity.
    inline impl::take_top_n_by<by::identity> take_top_n(size_t n)
    {
        return { by::identity{}, n };
    }



    /// @}
    /// @defgroup uniq Uniquefying
    /// @{

    /// @brief Keep first element from every adjacently-equal run of elements.
    /// 
    /// If arg is a container, apply erase-unique idiom and return
    /// the container.
    ///
    /// If arg is a `seq<In>`, compose `seq<Out>` that
    /// will yield first element from every adjacently-equal run of elements.
    template<typename F>
    impl::unique_adjacent_by<F> unique_adjacent_by(F key_fn)
    {
        return { std::move(key_fn) };
    }

    inline impl::unique_adjacent_by<by::identity> unique_adjacent()
    {
        return { by::identity{} };
    }

    /// @brief Uniquefy elements globally, as-if `unique_adjacent_by` pre-sorted by same key.
    ///
    /// If arg is a container, move contents to vector, and then sort-by and unique-adjacent-by.
    ///
    /// If arg is a `seq<In>`, compose `seq<Out>` that will
    /// keep values of key_fn in a set, and skip already-seen elements. 
    ///
    /// NB: the lifetime of value returned by key_fn must be independent of arg.
    template<typename F>
    impl::unique_all_by<F> unique_all_by(F key_fn)
    {
        return { std::move(key_fn) };
    }

    inline impl::unique_all_by<by::identity> unique_all()
    {
        return { by::identity{} };
    }    
    

    /// @}
    /// @defgroup concat Combining
    /// @{

    /// @brief Flatten the result of `group_all_by` or `group_adjacent_by`. 
    ///
    /// Given a `ContainerA<ContainerB<...>>`, move all elements and return `ContainerB<...>`.
    ///
    /// Given a seq-of-iterables `seq<In>`, compose `seq<Out>` that will lazily yield elements 
    /// of each iterable in seq.
    inline impl::concat concat()
    {
        return {};
    }

    /// @brief Yield elements of next after elements of arg.
    /*!
    @code
        auto res = vec_t{{1,2}}
                 % fn::append( vec_t{{3}} )
                 % fn::to_vector();

        VERIFY((res == vec_t{{1,2,3}}));
    @endcode
    */
    template<typename Iterable>
    impl::append<Iterable> append(Iterable next)
    {
        return { std::move(next) };
    }

    /// @brief Yield pairs of elements, (up to end of the shorter range)
    /*!
    @code
        auto res = vec_t{{1,2}}
                 % fn::zip_with( vec_t{{3,4,5}}, [](int x, int y)
                   {
                        return x*10 + y;
                   })
                 % fn::to_vector();

        VERIFY((res == vec_t{{13, 24}}));
    @endcode
    */
    template<typename Iterable, typename BinaryFn>
    impl::zip_with<Iterable, BinaryFn> zip_with(Iterable second, BinaryFn fn)
    {
        // We could have provided zip2 instead, returning a pair of elements,
        // but more often than not that pair will need to be transformed,
        // so instead we provide generalized zip_with that also takes the
        // binary transform-function, obviating the need in separate transform-stage.
        // If necessary, the transform-function can simply yield std::make_pair.

        return { std::move(second), std::move(fn) };
    }

    /// @brief Yield invocations of `fn` over pairs of adjacent inputs.
    template<typename BinaryFn>
    impl::zip_adjacent<BinaryFn> zip_adjacent(BinaryFn fn)
    {
        return { std::move(fn) };
    }

    // @brief Outer zip_with.
    template<typename Iterable, typename BinaryFn>
    impl::cartesian_product_with<Iterable, BinaryFn> cartesian_product_with(Iterable second, BinaryFn fn)
    {
        return { std::move(second), std::move(fn) };
    }

    /// @}
    /// @defgroup el_access Element Access
    /// @{

    /////////////////////////////////////////////////////////////////////////////
    /*! @brief Access unique element matching the predicate.
     *
     * Throw unless found exactly one element matching the predicate.
     * Returns const or non-const reference depending on the constness of the container.
     * @see set_unique
    @code
        const CConstRef<CUser_object>& model_evidence_uo = 
            fn::get_unique(seq_feat.GetExts(), [](CConstRef<CUser_object> uo)
            {
                return uo->GetType().GetStr() == "ModelEvidence";
            });
    @endcode
    */
    template<typename Container, typename P>
    auto get_unique(Container& container, P&& pred) -> decltype(*container.begin())
    {
        auto best_it = container.end();
        size_t n = 0;

        for(auto it   = container.begin(), 
                 it_end = container.end();

                 it != it_end; ++it)
        {
            if(pred(*it)) {
                best_it = it;
                ++n;
            }
        }

        if(n != 1) {
            RANGELESS_FN_THROW("Expected unique element satisfying search criteria, found " 
                          + std::to_string(n) + ".");
        }

        return *best_it;
    }

    /////////////////////////////////////////////////////////////////////////////
    /// @brief Similar to get_unique, but end-insert an element if missing.
    ///
    /*!
    @code
        CRef<CSeqdesc>& gb_desc =
            fn::set_unique(seq_entry.SetDescr().Set(), [](CConstRef<CSeqdesc> d)
            {    
                return d->IsGenbank();
            },   
            [] // add if missing (must satisfy pred)
            {    
                auto g = Ref(new CSeqdesc);
                g->SetGenbank();
                return g;
            });  
    @endcode
    */
    template<typename Container, typename P, typename Construct>
    auto set_unique(Container& container, P&& pred, Construct&& con) -> decltype(*container.begin())
    {
        auto best_it = container.end();
        size_t n = 0;

        for(auto it   = container.begin(), 
                 it_end = container.end();

                 it != it_end; ++it)
        {
            if(pred(*it)) {
                best_it = it;
                ++n;
            }
        }

        if(n == 0) {
            best_it = container.insert(container.end(), con());
            ++n;
            if(!pred(*best_it)) {
                RANGELESS_FN_THROW("New element does not satisfy predicate.");
            }
        }

        if(n != 1) {
            RANGELESS_FN_THROW("Expected unique element satisfying search criteria, found " 
                          + std::to_string(n) + ".");
        }

        return *best_it;
    }


    /////////////////////////////////////////////////////////////////////////////

    /// e.g. `const CConstRef<CSeq_align> aln = first_or_default( get_alns_annot(...)->Get() );`
    template<typename Container>
    auto first_or_default(const Container& c) -> typename Container::value_type
    {
        return c.begin() == c.end() ? typename Container::value_type{} : *c.begin();
    }

    template<typename Container, typename Pred>
    auto first_or_default(const Container& c, Pred&& pred) -> typename Container::value_type
    {
        auto it = std::find_if(c.begin(), c.end(), std::forward<Pred>(pred));
        return it == c.end() ? typename Container::value_type{} : *it;
    }

    template<typename Container>
    auto last_or_default(const Container& c) -> typename Container::value_type
    {
        return c.rbegin() == c.rend() ? typename Container::value_type{} : *c.rbegin();
    }

    template<typename Container, typename Pred>
    auto last_or_default(const Container& c, Pred&& pred) -> typename Container::value_type
    {
        auto it = std::find_if(c.rbegin(), c.rend(), std::forward<Pred>(pred));
        return it == c.rend() ? typename Container::value_type{} : *it;
    }

    /// @}
    /// @defgroup other Util
    /// @{

    /// @brief Memoizing wrapper for non-recursive non-mutable unary lambdas (not synchronized).
    /*!
    @code
        size_t exec_count = 0;
        auto fn = make_memoized([&](int x){ exec_count++; return x*2; });
        
        VERIFY(fn(1) == 2);
        VERIFY(fn(2) == 4);
        VERIFY(fn(1) == 2);
        VERIFY(exec_count == 2);
    @endcode
    */
    template<typename F>
    impl::memoizer<F> make_memoized(F fn)
    {
        return { std::move(fn), {} };
    }

    /////////////////////////////////////////////////////////////////////////
    /// @brief Basic scope guard - execute some code in guard`s destructor.
    /*!
    @code
        {{
            // ...

            auto on_exit = fn::make_scope_guard([&]
            {
                std::cerr << "Executing clean-up or roll-back...\n";
            });

            on_exit.dismiss(); // Cancel if no longer applicable.
        }}
    @endcode
    */
    template<typename F>
    impl::scope_guard<F> make_scope_guard(F fn)
    {
        return { std::move(fn), false };
    }

    /////////////////////////////////////////////////////////////////////////
    /// Similar to `std::tie`; except capture lvalues as lvalue-references, and rvalues as values.
    /*!
    @code
        const int x = 0;
        const char* foo = "foo";
        auto tpl = fn::tie_lvals(x, 42, std::ref(x), foo, "abc");
        static_assert(std::is_same<decltype(tpl), std::tuple<const int&, int, std::reference_wrapper<const int>, const char*&, const char (&)[4]>>::value, "");
    @code
    */
    template<typename... Ts>
    auto tie_lvals(Ts&&... xs) -> std::tuple<Ts...>
    {
        return std::tuple<Ts...>(std::forward<Ts>(xs)...);
    }

    /// @}


namespace operators
{
    // Why operator % ?
    // Because many other libraries overload >> or | for various purposes,
    // so in case of compilation errors involving those 
    // you get an honorable mention of every possible overload in TU.
    //
    // Also, in range-v3 it is used for composition of views
    // rather than a function application, so we want to avoid possible confusion.

    /// @brief `return std::forward<F>(fn)(std::forward<Arg>(arg))`
    ///
    /// This is similar to Haskell's operator `(&) :: a -> (a -> b) -> b |infix 1|` or F#'s operator `|>`
    
#if 0 && (defined(__GNUC__) || defined(__clang__))
    __attribute__ ((warn_unused_result))
    // A user may forget to iterate over the sequence, e.g.
    //         std::move(inputs) % fn::transform(...); // creates and immediately destroys a lazy-seq.
    // whereas the user code probably intended:
    //         std::move(inputs) % fn::transform(...) % fn::for_each(...);
    // 
    // To deal with this we could make operator% nodiscard / warn_unused_result,
    // but disabling for now because I can't figure out how to suppress the 
    // warning from the final % for_each(...).
#endif 
    template<typename Arg, typename F>
    auto operator % (Arg&& arg, F&& fn) -> decltype( std::forward<F>(fn)(std::forward<Arg>(arg)) )
    {
        // NB: forwarding fn too because it may have rvalue-specific overloads
        return std::forward<F>(fn)(std::forward<Arg>(arg));
    }

    // Note: in operator %= and <<= below we're not returning the original reference
    // because the operators are right-to-left associative, so it makes no sense to do it.

    /// @brief `arg = fn::to(Arg{})(std::forward<F>(fn)(std::move(arg)));`
    ///
    /// `strs %= fn::where([](const std::string& s){ return !s.empty(); }); // drop empty strings`
    template<typename Arg, typename F>
    auto operator %= (Arg& arg, F&& fn) -> decltype(void(std::forward<F>(fn)(std::move(arg))))
    {
        // NB: forwarding fn too because it may have rvalue-specific overloads.
        // Note: result-type may be not the same as arg, so we 
        // have to move the elements rather than simply assign.
        arg = fn::to(Arg{})(std::forward<F>(fn)(std::move(arg)));
    }

    /// @brief End-insert elements of cont2 into cont1 by-move.
    /*!
    @code
        out <<= GetItems();

        // equivalent of:
        {{
            auto items = GetItems();
            for(auto&& item : items) {
                out.insert(out.end(), std::move(item));
            }
        }}
    @endcode
    */
    template<class Container1, class Container2>
    auto operator<<=(Container1& cont1, 
                    Container2&& cont2) -> decltype(void(cont1.insert(cont1.end(), std::move(*cont2.begin()))))
    {
        static_assert(std::is_rvalue_reference<Container2&&>::value, "");
        cont1.insert(cont1.end(),
                     std::make_move_iterator(cont2.begin()),
                     std::make_move_iterator(cont2.end()));
    }

    // Could also take Container2 by value, but taking by rvalue-reference instead
    // will preserve the internal storage of the container (instead of it being 
    // freed here when going out of scope if we took it by value). In some cases
    // this may be desirable. So instead having separate overloads for 
    // Container2&& and const Container2& that will copy elements.

    template<class Container1, class Container2>
    auto operator<<=(Container1& cont1, 
               const Container2& cont2) -> decltype(void(cont1.insert(cont1.end(), *cont2.begin())))
    {
        cont1.insert(cont1.end(),
                     cont2.begin(),
                     cont2.end());
    }

    // I would have expected that seq-based input would work with the above overload as well,
    // but that is not so - after wrapping into std::make_move_iterator we're getting 
    // compilation errors about missing operators +,+=,-,-= for the iterator.
    // Hence the special overload for seq (it already yields rvalue-references)
    template<class Container1, class Gen>
    void operator<<=(Container1& cont1, impl::seq<Gen> seq)
    {
        cont1.insert(cont1.end(), seq.begin(), seq.end());
    }

    template<class Container>
    void operator<<=(Container& cont, typename Container::value_type el)
    {
         cont.insert(cont.end(), std::move(el));
    }

} // namespace operators

}